

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::value::quath> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::quath>
          (optional<tinyusdz::value::quath> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<tinyusdz::value::quath> local_22;
  
  bVar1 = is_blocked(this);
  if ((!bVar1) && (bVar1 = has_value(this), bVar1)) {
    tinyusdz::value::Value::get_value<tinyusdz::value::quath>(&local_22,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_22.has_value_;
    if (local_22.has_value_ != true) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->contained = local_22.contained;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = false;
  __return_storage_ptr__->contained = (storage_t<tinyusdz::value::quath>)0x0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }